

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::WriteParseError(cmServer *this,cmConnection *connection,string *message)

{
  Value *pVVar1;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_70;
  undefined1 local_48 [8];
  Value obj;
  string *message_local;
  cmConnection *connection_local;
  cmServer *this_local;
  
  obj.limit_ = (size_t)message;
  Json::Value::Value((Value *)local_48,objectValue);
  Json::Value::Value(&local_70,&kERROR_TYPE_abi_cxx11_);
  pVVar1 = Json::Value::operator[]((Value *)local_48,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_a8,(string *)obj.limit_);
  pVVar1 = Json::Value::operator[]((Value *)local_48,&kERROR_MESSAGE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_a8);
  Json::Value::~Value(&local_a8);
  Json::Value::Value(&local_d0,"");
  pVVar1 = Json::Value::operator[]((Value *)local_48,&kREPLY_TO_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,"");
  pVVar1 = Json::Value::operator[]((Value *)local_48,&kCOOKIE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_f8);
  Json::Value::~Value(&local_f8);
  WriteJsonObject(this,connection,(Value *)local_48,(DebugInfo *)0x0);
  Json::Value::~Value((Value *)local_48);
  return;
}

Assistant:

void cmServer::WriteParseError(cmConnection* connection,
                               const std::string& message) const
{
  Json::Value obj = Json::objectValue;
  obj[kTYPE_KEY] = kERROR_TYPE;
  obj[kERROR_MESSAGE_KEY] = message;
  obj[kREPLY_TO_KEY] = "";
  obj[kCOOKIE_KEY] = "";

  this->WriteJsonObject(connection, obj, nullptr);
}